

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitTry(PrintSExpression *this,Try *curr)

{
  Name *pNVar1;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  ostream *in_RCX;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  Name name;
  Name name_00;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  poVar5 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  poVar5 = this->o;
  Colors::outputColorCode(poVar5,"\x1b[35m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"do",2);
  Colors::outputColorCode(poVar5,"\x1b[0m");
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body,true);
  decIndent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements == 0
     ) {
    uVar4 = 0;
  }
  else {
    lVar7 = 8;
    uVar8 = 0;
    do {
      poVar5 = this->o;
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      printDebugDelimiterLocation(this,(Expression *)curr,(Index)uVar8);
      local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
      poVar5 = this->o;
      Colors::outputColorCode(poVar5,"\x1b[35m");
      Colors::outputColorCode(poVar5,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"catch ",6);
      Colors::outputColorCode(poVar5,"\x1b[0m");
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar8) {
        pcVar6 = 
        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
        ;
LAB_008434d2:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,pcVar6);
      }
      pNVar1 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
      name.super_IString.str._M_str = (char *)this->o;
      name.super_IString.str._M_len = *(size_t *)((long)&(pNVar1->super_IString).str._M_len + lVar7)
      ;
      anon_unknown_217::printName(*(anon_unknown_217 **)((long)pNVar1 + lVar7 + -8),name,in_RCX);
      incIndent(this);
      if ((curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar8) {
        pcVar6 = 
        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
        ;
        goto LAB_008434d2;
      }
      maybePrintImplicitBlock
                (this,(curr->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data[uVar8],true);
      decIndent(this);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
      uVar8 = uVar8 + 1;
      uVar4 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < uVar4);
  }
  poVar5 = (ostream *)
           ((curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
           - uVar4);
  if (poVar5 == (ostream *)&DAT_00000001) {
    poVar5 = this->o;
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    printDebugDelimiterLocation
              (this,(Expression *)curr,
               (Index)(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements);
    local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    poVar5 = this->o;
    Colors::outputColorCode(poVar5,"\x1b[35m");
    Colors::outputColorCode(poVar5,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"catch_all",9);
    Colors::outputColorCode(poVar5,"\x1b[0m");
    incIndent(this);
    sVar2 = (curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar2 == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    poVar5 = (ostream *)
             (curr->catchBodies).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    maybePrintImplicitBlock(this,*(Expression **)(poVar5 + sVar2 * 8 + -8),true);
    decIndent(this);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  if ((curr->delegateTarget).super_IString.str._M_str != (char *)0x0) {
    poVar3 = this->o;
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    poVar3 = this->o;
    Colors::outputColorCode(poVar3,"\x1b[35m");
    Colors::outputColorCode(poVar3,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"delegate ",9);
    Colors::outputColorCode(poVar3,"\x1b[0m");
    pcVar6 = (curr->delegateTarget).super_IString.str._M_str;
    if (pcVar6 == DAT_00da8070) {
      std::ostream::operator<<(this->o,this->controlFlowDepth);
    }
    else {
      name_00.super_IString.str._M_str = (char *)this->o;
      name_00.super_IString.str._M_len = (size_t)pcVar6;
      anon_unknown_217::printName
                ((anon_unknown_217 *)(curr->delegateTarget).super_IString.str._M_len,name_00,poVar5)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->o,")\n",2);
  }
  decIndent(this);
  if (this->full == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o," ;; end try",0xb);
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    controlFlowDepth++;
    o << '(';
    printExpressionContents(curr);
    incIndent();
    doIndent(o, indent);
    o << '(';
    printMedium(o, "do");
    incIndent();
    maybePrintImplicitBlock(curr->body, true);
    decIndent();
    o << "\n";
    for (size_t i = 0; i < curr->catchTags.size(); i++) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, i);
      o << '(';
      printMedium(o, "catch ");
      printName(curr->catchTags[i], o);
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies[i], true);
      decIndent();
      o << "\n";
    }
    if (curr->hasCatchAll()) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, curr->catchTags.size());
      o << '(';
      printMedium(o, "catch_all");
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies.back(), true);
      decIndent();
      o << "\n";
    }
    controlFlowDepth--;

    if (curr->isDelegate()) {
      doIndent(o, indent);
      o << '(';
      printMedium(o, "delegate ");
      if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
        o << controlFlowDepth;
      } else {
        printName(curr->delegateTarget, o);
      }
      o << ")\n";
    }
    decIndent();
    if (full) {
      o << " ;; end try";
    }
  }